

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::UnitTestImpl::RecordProperty(UnitTestImpl *this,TestProperty *test_property)

{
  TestResult *local_40;
  TestResult *test_result;
  string xml_element;
  TestProperty *test_property_local;
  UnitTestImpl *this_local;
  
  xml_element.field_2._8_8_ = test_property;
  std::__cxx11::string::string((string *)&test_result);
  if (this->current_test_info_ == (TestInfo *)0x0) {
    if (this->current_test_case_ == (TestCase *)0x0) {
      std::__cxx11::string::operator=((string *)&test_result,"testsuites");
      local_40 = &this->ad_hoc_test_result_;
    }
    else {
      std::__cxx11::string::operator=((string *)&test_result,"testsuite");
      local_40 = &this->current_test_case_->ad_hoc_test_result_;
    }
  }
  else {
    std::__cxx11::string::operator=((string *)&test_result,"testcase");
    local_40 = &this->current_test_info_->result_;
  }
  TestResult::RecordProperty
            (local_40,(string *)&test_result,(TestProperty *)xml_element.field_2._8_8_);
  std::__cxx11::string::~string((string *)&test_result);
  return;
}

Assistant:

void UnitTestImpl::RecordProperty(const TestProperty& test_property) {
  std::string xml_element;
  TestResult* test_result;  // TestResult appropriate for property recording.

  if (current_test_info_ != nullptr) {
    xml_element = "testcase";
    test_result = &(current_test_info_->result_);
  } else if (current_test_case_ != nullptr) {
    xml_element = "testsuite";
    test_result = &(current_test_case_->ad_hoc_test_result_);
  } else {
    xml_element = "testsuites";
    test_result = &ad_hoc_test_result_;
  }
  test_result->RecordProperty(xml_element, test_property);
}